

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool flatbuffers::anon_unknown_0::compareName<flatbuffers::StructDef>(StructDef *a,StructDef *b)

{
  uint uVar1;
  size_type __n;
  ulong uVar2;
  string local_58;
  string local_38;
  
  Namespace::GetFullyQualifiedName
            (&local_58,(a->super_Definition).defined_namespace,(string *)a,1000);
  Namespace::GetFullyQualifiedName
            (&local_38,(b->super_Definition).defined_namespace,(string *)b,1000);
  __n = local_58._M_string_length;
  if (local_38._M_string_length < local_58._M_string_length) {
    __n = local_38._M_string_length;
  }
  if (__n == 0) {
    uVar2 = 0;
  }
  else {
    uVar1 = memcmp(local_58._M_dataplus._M_p,local_38._M_dataplus._M_p,__n);
    uVar2 = (ulong)uVar1;
  }
  if ((int)uVar2 == 0) {
    uVar2 = 0xffffffff80000000;
    if (-0x80000000 < (long)(local_58._M_string_length - local_38._M_string_length)) {
      uVar2 = local_58._M_string_length - local_38._M_string_length;
    }
    if (0x7ffffffe < (long)uVar2) {
      uVar2 = 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return (bool)((byte)(uVar2 >> 0x1f) & 1);
}

Assistant:

static bool compareName(const T *a, const T *b) {
  return a->defined_namespace->GetFullyQualifiedName(a->name) <
         b->defined_namespace->GetFullyQualifiedName(b->name);
}